

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Sendrecv_replace
              (void *buf,int count,MPIABI_Datatype datatype,int dest,int sendtag,int source,
              int recvtag,MPIABI_Comm comm,MPIABI_Status *status)

{
  undefined8 uVar1;
  int iVar2;
  MPI_Status *mpi_status_ptr;
  
  iVar2 = MPI_Sendrecv_replace();
  if (status != (MPIABI_Status *)0x0) {
    uVar1 = *(undefined8 *)&status->mpi_status;
    status->MPI_SOURCE = (int)uVar1;
    status->MPI_TAG = (int)((ulong)uVar1 >> 0x20);
    status->MPI_ERROR = (status->mpi_status).status_OpenMPI.f2;
  }
  return iVar2;
}

Assistant:

int MPIABI_Sendrecv_replace(
  void * buf,
  int count,
  MPIABI_Datatype datatype,
  int dest,
  int sendtag,
  int source,
  int recvtag,
  MPIABI_Comm comm,
  MPIABI_Status * status
) {
  return MPI_Sendrecv_replace(
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    dest,
    sendtag,
    source,
    recvtag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}